

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

void nes_inesmap(int *ip)

{
  int iVar1;
  int svalue;
  int *ip_local;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (((int)value < 0) || (0xff < (int)value)) {
      error("Mapper value out of range!");
    }
    else {
      ines_mapper[0] = (value & 0xf) << 4 | ines_mapper[0] & 0xfU;
      ines_mapper[1] = value & 0xf0;
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
nes_inesmap(int *ip)
{
	if (!evaluate(ip, ';'))
		return;

    int svalue = (int)value;
	if ((svalue < 0) || (svalue > 255)) 
	{
		error("Mapper value out of range!");
	
		return;
	}
	
	ines_mapper[0] &= 0x0F;
	ines_mapper[0] |= (value & 0x0F) << 4;
	ines_mapper[1]  = (value & 0xF0);

	if (pass == LAST_PASS) 
	{
		println();
	}
}